

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Expression * __thiscall hdc::Parser::parse_bitwise_xor_expression(Parser *this)

{
  bool bVar1;
  reference pTVar2;
  Expression *this_00;
  Expression *right;
  Expression *local_48;
  Expression *expression;
  Token oper;
  Parser *this_local;
  
  oper._40_8_ = this;
  Token::Token((Token *)&expression);
  local_48 = parse_bitwise_and_expression(this);
  while( true ) {
    bVar1 = match(this,TK_BITWISE_XOR);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
             ::operator*(&this->matched);
    Token::operator=((Token *)&expression,pTVar2);
    this_00 = (Expression *)operator_new(0x68);
    right = parse_bitwise_and_expression(this);
    BitwiseXorExpression::BitwiseXorExpression
              ((BitwiseXorExpression *)this_00,(Token *)&expression,local_48,right);
    local_48 = this_00;
  }
  Token::~Token((Token *)&expression);
  return local_48;
}

Assistant:

Expression* Parser::parse_bitwise_xor_expression() {
    Token oper;
    Expression* expression = parse_bitwise_and_expression();

    while (true) {
        if (match(TK_BITWISE_XOR)) {
            oper = *matched;
            expression = new BitwiseXorExpression(oper, expression, parse_bitwise_and_expression());
        } else {
            break;
        }
    }

    return expression;
}